

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

void Abc_SuppProfile(Vec_Wec_t *pS,Vec_Wec_t *pD,int nVars)

{
  long lVar1;
  ulong uVar2;
  
  if (0 < nVars) {
    lVar1 = 4;
    uVar2 = 0;
    do {
      if (((long)pS->nSize <= (long)uVar2) || ((long)pD->nSize <= (long)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0xd3,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
      }
      printf("%2d : S = %3d  D = %3d\n",uVar2 & 0xffffffff,
             (ulong)*(uint *)((long)&pS->pArray->nCap + lVar1),
             (ulong)*(uint *)((long)&pD->pArray->nCap + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while ((uint)nVars != uVar2);
  }
  return;
}

Assistant:

void Abc_SuppProfile( Vec_Wec_t * pS, Vec_Wec_t * pD, int nVars )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        printf( "%2d : S = %3d  D = %3d\n", v, Vec_WecLevelSize(pS, v), Vec_WecLevelSize(pD, v) );
}